

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_coefficients_to_phase_spectrum.cc
# Opt level: O2

bool __thiscall
sptk::FilterCoefficientsToPhaseSpectrum::Run
          (FilterCoefficientsToPhaseSpectrum *this,
          vector<double,_std::allocator<double>_> *numerator_coefficients,
          vector<double,_std::allocator<double>_> *denominator_coefficients,
          vector<double,_std::allocator<double>_> *phase_spectrum,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  double dVar1;
  double dVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  bool bVar7;
  uint uVar8;
  pointer pdVar9;
  long lVar10;
  size_t sVar11;
  size_type __new_size;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  if ((this->is_valid_ == true) &&
     (lVar13 = (long)(numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 3,
     lVar13 == (long)this->num_numerator_order_ + 1)) {
    if (buffer == (Buffer *)0x0) {
      return false;
    }
    if (phase_spectrum == (vector<double,_std::allocator<double>_> *)0x0) {
      return false;
    }
    lVar10 = (long)(denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    if (lVar10 != (long)this->num_denominator_order_ + 1) {
      return false;
    }
    iVar12 = this->fft_length_;
    uVar8 = iVar12 / 2 + 1;
    if ((long)(phase_spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(phase_spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != (long)(int)uVar8) {
      std::vector<double,_std::allocator<double>_>::resize(phase_spectrum,(long)(int)uVar8);
      iVar12 = this->fft_length_;
    }
    this_00 = &buffer->real_part1_;
    __new_size = (size_type)iVar12;
    if ((long)(buffer->real_part1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(buffer->real_part1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != __new_size) {
      std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size);
      __new_size = (size_type)this->fft_length_;
    }
    this_01 = &buffer->real_part2_;
    if ((long)(buffer->real_part2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(buffer->real_part2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != __new_size) {
      std::vector<double,_std::allocator<double>_>::resize(this_01,__new_size);
    }
    pdVar3 = (numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar11 = (long)(numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)pdVar3;
    if (sVar11 != 0) {
      memmove(pdVar9,pdVar3,sVar11);
      pdVar9 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    pdVar3 = (buffer->real_part1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar9 = pdVar9 + lVar13; pdVar9 != pdVar3; pdVar9 = pdVar9 + 1) {
      *pdVar9 = 0.0;
    }
    pdVar3 = (denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl
             .super__Vector_impl_data._M_start;
    pdVar9 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar11 = (long)(denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)pdVar3;
    if (sVar11 != 0) {
      memmove(pdVar9,pdVar3,sVar11);
      pdVar9 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    pdVar3 = (buffer->real_part2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar9 = pdVar9 + lVar10; pdVar9 != pdVar3; pdVar9 = pdVar9 + 1) {
      *pdVar9 = 0.0;
    }
    bVar7 = RealValuedFastFourierTransform::Run
                      (&this->fast_fourier_transform_,this_00,&buffer->imag_part1_,
                       &buffer->buffer_for_fast_fourier_transform_);
    if (bVar7) {
      *(buffer->real_part2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start = 1.0;
      bVar7 = RealValuedFastFourierTransform::Run
                        (&this->fast_fourier_transform_,this_01,&buffer->imag_part2_,
                         &buffer->buffer_for_fast_fourier_transform_);
      uVar14 = 0;
      if (!bVar7) {
        return false;
      }
      pdVar9 = (phase_spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (buffer->imag_part1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar15 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar15 = uVar14;
      }
      pdVar6 = (buffer->imag_part2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar18 = 0.0;
      for (; uVar15 * 8 != uVar14; uVar14 = uVar14 + 8) {
        dVar16 = *(double *)((long)pdVar5 + uVar14);
        dVar17 = *(double *)((long)pdVar4 + uVar14);
        dVar1 = *(double *)((long)pdVar3 + uVar14);
        dVar2 = *(double *)((long)pdVar6 + uVar14);
        dVar16 = atan2(dVar16 * dVar17 - dVar2 * dVar1,dVar1 * dVar17 + dVar16 * dVar2);
        dVar16 = dVar16 * 0.3183098861837907;
        *(double *)((long)pdVar9 + uVar14) = dVar16;
        if ((uVar14 != 0) && (this->unwrapping_ != false)) {
          dVar17 = (dVar16 - *(double *)((long)pdVar9 + (uVar14 - 8))) + dVar18;
          if (dVar17 <= 1.0) {
            if (dVar17 < -1.0) {
              dVar18 = dVar18 + 2.0;
            }
          }
          else {
            dVar18 = dVar18 + -2.0;
          }
          *(double *)((long)pdVar9 + uVar14) = dVar16 + dVar18;
        }
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool FilterCoefficientsToPhaseSpectrum::Run(
    const std::vector<double>& numerator_coefficients,
    const std::vector<double>& denominator_coefficients,
    std::vector<double>* phase_spectrum,
    FilterCoefficientsToPhaseSpectrum::Buffer* buffer) const {
  // Check inputs.
  const int numerator_length(num_numerator_order_ + 1);
  const int denominator_length(num_denominator_order_ + 1);
  if (!is_valid_ ||
      numerator_coefficients.size() !=
          static_cast<std::size_t>(numerator_length) ||
      denominator_coefficients.size() !=
          static_cast<std::size_t>(denominator_length) ||
      NULL == phase_spectrum || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  const int output_length(fft_length_ / 2 + 1);
  if (phase_spectrum->size() != static_cast<std::size_t>(output_length)) {
    phase_spectrum->resize(output_length);
  }
  if (buffer->real_part1_.size() != static_cast<std::size_t>(fft_length_)) {
    buffer->real_part1_.resize(fft_length_);
  }
  if (buffer->real_part2_.size() != static_cast<std::size_t>(fft_length_)) {
    buffer->real_part2_.resize(fft_length_);
  }

  std::copy(numerator_coefficients.begin(), numerator_coefficients.end(),
            buffer->real_part1_.begin());
  std::fill(buffer->real_part1_.begin() + numerator_length,
            buffer->real_part1_.end(), 0.0);
  std::copy(denominator_coefficients.begin(), denominator_coefficients.end(),
            buffer->real_part2_.begin());
  std::fill(buffer->real_part2_.begin() + denominator_length,
            buffer->real_part2_.end(), 0.0);

  if (!fast_fourier_transform_.Run(
          &buffer->real_part1_, &buffer->imag_part1_,
          &buffer->buffer_for_fast_fourier_transform_)) {
    return false;
  }

  buffer->real_part2_[0] = 1.0;
  if (!fast_fourier_transform_.Run(
          &buffer->real_part2_, &buffer->imag_part2_,
          &buffer->buffer_for_fast_fourier_transform_)) {
    return false;
  }

  double* output(&((*phase_spectrum)[0]));
  const double* xr(&buffer->real_part1_[0]);
  const double* yr(&buffer->real_part2_[0]);
  const double* xi(&buffer->imag_part1_[0]);
  const double* yi(&buffer->imag_part2_[0]);

  const double inverse_pi(1.0 / sptk::kPi);
  double offset(0.0);

  for (int i(0); i < output_length; ++i) {
    output[i] = inverse_pi * std::atan2(xi[i] * yr[i] - xr[i] * yi[i],
                                        xr[i] * yr[i] + xi[i] * yi[i]);
    if (unwrapping_ && 0 < i) {
      const double diff(output[i] - output[i - 1] + offset);
      if (1.0 < diff) {
        offset -= 2.0;
      } else if (1.0 < -diff) {
        offset += 2.0;
      }
      output[i] += offset;
    }
  }

  return true;
}